

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerRollback(Pager *pPager)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  
  bVar1 = pPager->eState;
  if (bVar1 == 6) {
    return pPager->errCode;
  }
  if (bVar1 < 2) {
    return 0;
  }
  if (pPager->pWal == (Wal *)0x0) {
    if ((bVar1 != 2) && (pPager->jfd->pMethods != (sqlite3_io_methods *)0x0)) {
      uVar3 = pager_playback(pPager,0);
      goto LAB_00137f8c;
    }
    uVar3 = pager_end_transaction(pPager,0,0);
    if ((bVar1 == 2) || (pPager->memDb != '\0')) goto LAB_00137f8c;
    pPager->errCode = 4;
    pPager->eState = '\x06';
  }
  else {
    uVar2 = sqlite3PagerSavepoint(pPager,2,-1);
    uVar3 = pager_end_transaction(pPager,(uint)pPager->setSuper,0);
    if (uVar2 != 0) {
      uVar3 = uVar2;
    }
LAB_00137f8c:
    if (((char)uVar3 != '\r') && ((uVar3 & 0xff) != 10)) {
      return uVar3;
    }
    pPager->errCode = uVar3;
    pPager->eState = '\x06';
    if (uVar3 == 0) {
      if (pPager->bUseFetch == '\0') {
        pcVar4 = getPageNormal;
      }
      else {
        pcVar4 = getPageMMap;
      }
      goto LAB_00137fe7;
    }
  }
  pcVar4 = getPageError;
LAB_00137fe7:
  pPager->xGet = pcVar4;
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerRollback(Pager *pPager){
  int rc = SQLITE_OK;                  /* Return code */
  PAGERTRACE(("ROLLBACK %d\n", PAGERID(pPager)));

  /* PagerRollback() is a no-op if called in READER or OPEN state. If
  ** the pager is already in the ERROR state, the rollback is not
  ** attempted here. Instead, the error code is returned to the caller.
  */
  assert( assert_pager_state(pPager) );
  if( pPager->eState==PAGER_ERROR ) return pPager->errCode;
  if( pPager->eState<=PAGER_READER ) return SQLITE_OK;

  if( pagerUseWal(pPager) ){
    int rc2;
    rc = sqlite3PagerSavepoint(pPager, SAVEPOINT_ROLLBACK, -1);
    rc2 = pager_end_transaction(pPager, pPager->setSuper, 0);
    if( rc==SQLITE_OK ) rc = rc2;
  }else if( !isOpen(pPager->jfd) || pPager->eState==PAGER_WRITER_LOCKED ){
    int eState = pPager->eState;
    rc = pager_end_transaction(pPager, 0, 0);
    if( !MEMDB && eState>PAGER_WRITER_LOCKED ){
      /* This can happen using journal_mode=off. Move the pager to the error
      ** state to indicate that the contents of the cache may not be trusted.
      ** Any active readers will get SQLITE_ABORT.
      */
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
      return rc;
    }
  }else{
    rc = pager_playback(pPager, 0);
  }

  assert( pPager->eState==PAGER_READER || rc!=SQLITE_OK );
  assert( rc==SQLITE_OK || rc==SQLITE_FULL || rc==SQLITE_CORRUPT
          || rc==SQLITE_NOMEM || (rc&0xFF)==SQLITE_IOERR
          || rc==SQLITE_CANTOPEN
  );

  /* If an error occurs during a ROLLBACK, we can no longer trust the pager
  ** cache. So call pager_error() on the way out to make any error persistent.
  */
  return pager_error(pPager, rc);
}